

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filetree.c
# Opt level: O2

Filetree filetree_init(char **roots,size_t roots_size,gboolean recursive,gboolean follow_symlinks,
                      gboolean no_sort,GSList **errors)

{
  int iVar1;
  Filetree pvVar2;
  GDir *current_dir;
  GSList *pGVar3;
  undefined8 uVar4;
  filename_representations *pfVar5;
  GTree *current_tree;
  size_t sVar6;
  code *pcVar7;
  long local_40;
  size_t local_38;
  
  pcVar7 = compare_insert_last;
  if (no_sort == 0) {
    pcVar7 = compare_filenames;
  }
  local_38 = roots_size;
  pvVar2 = (Filetree)g_tree_new_full(pcVar7,0,filename_representations_free,filetree_destroy);
  sVar6 = 0;
  do {
    if (local_38 == sVar6) {
      pGVar3 = (GSList *)g_slist_reverse(*errors);
      *errors = pGVar3;
      return pvVar2;
    }
    if ((follow_symlinks != 0) || (iVar1 = g_file_test(roots[sVar6],2), iVar1 == 0)) {
      iVar1 = g_file_test(roots[sVar6],4);
      if (iVar1 == 0) {
        iVar1 = g_file_test(roots[sVar6],1);
        if (iVar1 == 0) {
          pGVar3 = *errors;
          uVar4 = g_error_new(1,1,"File \'%s\' not found",roots[sVar6]);
          goto LAB_0010354a;
        }
        pfVar5 = filename_representations_new(roots[sVar6],2);
        g_tree_insert(pvVar2,pfVar5,0);
      }
      else if (recursive == 0) {
        pGVar3 = *errors;
        uVar4 = g_error_new(1,1,"Skipping \'%s\', is a directory",roots[sVar6]);
LAB_0010354a:
        pGVar3 = (GSList *)g_slist_prepend(pGVar3,uVar4);
        *errors = pGVar3;
      }
      else {
        local_40 = 0;
        current_dir = (GDir *)g_dir_open(roots[sVar6],0,&local_40);
        if (local_40 == 0) {
          pfVar5 = filename_representations_new(roots[sVar6],1);
          current_tree = (GTree *)g_tree_new_full(compare_filenames,0,filename_representations_free,
                                                  filetree_destroy);
          g_tree_insert(pvVar2,pfVar5,current_tree);
          walk_recursive(roots[sVar6],current_dir,current_tree,follow_symlinks,errors);
          g_dir_close(current_dir);
        }
        else {
          pGVar3 = (GSList *)g_slist_prepend(*errors);
          *errors = pGVar3;
        }
      }
    }
    sVar6 = sVar6 + 1;
  } while( true );
}

Assistant:

Filetree filetree_init(char *roots[],
                       size_t roots_size,
                       gboolean recursive,
                       gboolean follow_symlinks,
                       gboolean no_sort,
                       GSList **errors)
{
    GTree *root_tree = g_tree_new_full(no_sort ? compare_insert_last
                                               : compare_filenames,
                                       NULL,
                                       filename_representations_free,
                                       filetree_destroy);
    size_t i;

    for (i = 0; i < roots_size; ++i) {
        GTree *sub_dir_tree;
        GDir *dir;
        GError *err;
        struct filename_representations *fr;

        if (!follow_symlinks
            && g_file_test(roots[i], G_FILE_TEST_IS_SYMLINK)) {
            continue;
        }

        if (g_file_test(roots[i], G_FILE_TEST_IS_DIR)) {
            if (!recursive) {
                *errors = g_slist_prepend(*errors, g_error_new(1, 1,
                            "Skipping '%s', is a directory", roots[i]));
                continue;
            }
            err = NULL;
            dir = g_dir_open(roots[i], 0, &err);
            if (err) {
                *errors = g_slist_prepend(*errors, err);
                err = NULL;
                continue;
            }
            fr = filename_representations_new(roots[i], FILETREE_DIR);
            sub_dir_tree = g_tree_new_full(compare_filenames, NULL,
                                           filename_representations_free,
                                           filetree_destroy);

            g_tree_insert(root_tree, fr, sub_dir_tree);
            walk_recursive(roots[i], dir, sub_dir_tree,
                           follow_symlinks, errors);
            g_dir_close(dir);
        } else if (g_file_test(roots[i], G_FILE_TEST_IS_REGULAR)) {
            fr = filename_representations_new(roots[i], FILETREE_FILE);
            g_tree_insert(root_tree, fr, NULL);
        } else {
            *errors = g_slist_prepend(*errors, g_error_new(1, 1,
                        "File '%s' not found", roots[i]));
        }
    }

    *errors = g_slist_reverse(*errors);

    return root_tree;
}